

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O0

void __thiscall wasm::ReferenceFinder::visitStructGet(ReferenceFinder *this,StructGet *curr)

{
  bool bVar1;
  StructField structField;
  bool local_39;
  undefined1 local_38 [12];
  HeapType local_28;
  HeapType type;
  StructGet *curr_local;
  ReferenceFinder *this_local;
  
  type.id._4_4_ = 1;
  bVar1 = wasm::Type::operator==(&curr->ref->type,(BasicType *)((long)&type.id + 4));
  local_39 = true;
  if (!bVar1) {
    local_39 = wasm::Type::isNull(&curr->ref->type);
  }
  if (local_39 == false) {
    local_28 = wasm::Type::getHeapType(&curr->ref->type);
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_unsigned_int_&,_true>
              ((pair<wasm::HeapType,_unsigned_int> *)local_38,&local_28,&curr->index);
    structField._12_4_ = 0;
    structField.first.id = local_38._0_8_;
    structField.second = local_38._8_4_;
    note(this,structField);
  }
  return;
}

Assistant:

void visitStructGet(StructGet* curr) {
    if (curr->ref->type == Type::unreachable || curr->ref->type.isNull()) {
      return;
    }
    auto type = curr->ref->type.getHeapType();
    note(StructField{type, curr->index});
  }